

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O1

bool __thiscall mpt::object::attribute::set(attribute *this,convertable *val)

{
  char *pcVar1;
  bool bVar2;
  int iVar3;
  
  pcVar1 = (this->_prop).name;
  if (pcVar1 != (char *)0x0) {
    iVar3 = (*this->_obj->_vptr_object[1])(this->_obj,pcVar1,val);
    if (iVar3 < 0) {
      bVar2 = false;
    }
    else {
      iVar3 = (**this->_obj->_vptr_object)(this->_obj,this);
      bVar2 = true;
      if (iVar3 < 0) {
        (this->_prop).name = (char *)0x0;
      }
    }
    return bVar2;
  }
  return false;
}

Assistant:

bool object::attribute::set(convertable &val)
{
	if (!_prop.name) {
		return false;
	}
	if (_obj.set_property(_prop.name, &val) < 0) {
		return false;
	}
	if (_obj.property(&_prop) < 0) {
		_prop.name = 0;
	}
	return true;
}